

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double obj_amp)

{
  int *args_1;
  undefined1 auVar1 [16];
  long lVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar3;
  uint uVar4;
  rc_size rVar5;
  row_iterator prVar6;
  int iVar7;
  uint r_size;
  ulong uVar8;
  long lVar9;
  long lVar10;
  rc_data *__last;
  rc_data *__first;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_98;
  int local_94;
  int *local_90;
  bit_array *local_88;
  undefined1 local_80 [16];
  rc_size local_70;
  solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
  *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_60;
  undefined8 local_58;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_50;
  double local_48;
  double local_40;
  double local_38;
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_88 = x;
  local_60._M_head_impl = (row_value *)obj_amp;
  local_48 = theta;
  local_40 = delta;
  local_38 = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&local_38,&local_40,&local_48);
  if (first._M_current == last._M_current) {
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
  }
  else {
    local_68 = this + 0x10;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_90 = last._M_current;
    do {
      local_98 = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_80,(int)local_68);
      if (local_80._8_8_ != local_80._0_8_) {
        lVar9 = *(long *)(this + 0x50);
        prVar6 = (row_iterator)local_80._8_8_;
        do {
          *(double *)(lVar9 + (long)prVar6->value * 8) =
               local_48 * *(double *)(lVar9 + (long)prVar6->value * 8);
          prVar6 = prVar6 + 1;
        } while (prVar6 != (row_iterator)local_80._0_8_);
      }
      local_50._M_head_impl = (col_value *)first._M_current;
      rVar5 = solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,(row_iterator)local_80._8_8_,(row_iterator)local_80._0_8_,local_88)
      ;
      iVar7 = rVar5.r_size;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_60._M_head_impl;
      if (iVar7 != 0) {
        lVar9 = *(long *)(this + 0x60);
        lVar2 = *(long *)(*(long *)(this + 0x78) + 8);
        lVar10 = 0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ =
               *(ulong *)(lVar2 + (long)((row_iterator)
                                        (local_80._8_8_ + (long)*(int *)(lVar9 + 0xc + lVar10) * 8))
                                        ->column * 8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(lVar9 + lVar10);
          auVar1 = vfmadd213sd_fma(auVar11,auVar12,auVar1);
          *(long *)(lVar9 + lVar10) = auVar1._0_8_;
          lVar10 = lVar10 + 0x10;
        } while (((ulong)rVar5 & 0xffffffff) << 4 != lVar10);
      }
      if (1 < (long)iVar7) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x60);
        lVar9 = (long)rVar5 << 0x20;
        local_70 = rVar5;
        if (lVar9 != 0) {
          lVar2 = (long)&__first->value + (lVar9 >> 0x1c);
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,lVar2,(int)LZCOUNT((long)iVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,lVar2);
        }
        last._M_current = local_90;
        __last = __first + 1;
        if (lVar9 != 0x100000000) {
          lVar9 = (lVar9 >> 0x1c) + -0x10;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
        }
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        rVar5 = local_70;
      }
      args_1 = (int *)(*(long *)(this + 0x68) + (long)local_98 * 8);
      uVar4 = rVar5.c_size + *args_1;
      r_size = rVar5.r_size;
      if ((int)r_size < (int)uVar4) {
        uVar4 = r_size;
      }
      local_94 = uVar4 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_98,args_1);
      if (0 < (int)r_size) {
        uVar8 = (ulong)(r_size & 0x7fffffff);
        lVar9 = 0xc;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (double *)(*(long *)(this + 0x60) + -0xc + lVar9),
                     (int *)(*(long *)(this + 0x60) + lVar9));
          lVar9 = lVar9 + 0x10;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_94);
      bVar3 = affect<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,local_88,(row_value *)local_80._8_8_,local_98,local_94,r_size,
                         local_38,local_40);
      local_58._0_1_ = (byte)local_58 | bVar3;
      first._M_current = &(local_50._M_head_impl)->row;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_58 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }